

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O2

void __thiscall tcb::rational<long_long>::simplify(rational<long_long> *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = this->num_;
  uVar1 = this->denom_;
  uVar2 = uVar3;
  uVar4 = uVar1;
  while (uVar4 != 0) {
    uVar5 = (long)uVar2 % (long)uVar4;
    uVar2 = uVar4;
    uVar4 = uVar5;
  }
  uVar4 = -uVar2;
  if (0 < (long)uVar2) {
    uVar4 = uVar2;
  }
  uVar2 = -uVar3;
  if (-1 < (long)uVar1) {
    uVar2 = uVar3;
  }
  this->num_ = (long)uVar2 / (long)uVar4;
  uVar3 = -uVar1;
  if (0 < (long)uVar1) {
    uVar3 = uVar1;
  }
  this->denom_ = uVar3 / uVar4;
  return;
}

Assistant:

TCB_CONSTEXPR14 void simplify()
    {
        using namespace detail;
        auto g = abs(gcd(num_, denom_));
        num_ = sign(denom_) * num_/g;
        denom_ = abs(denom_)/g;
    }